

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wav.cpp
# Opt level: O3

void __thiscall
ASDCP::Wav::SimpleWaveHeader::FillADesc
          (SimpleWaveHeader *this,AudioDescriptor *ADesc,Rational PictureRate)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  double dVar4;
  
  ADesc->EditRate = PictureRate;
  ADesc->LinkedTrackID = 0;
  ADesc->Locked = 0;
  uVar1 = this->nchannels;
  ADesc->ChannelCount = (uint)uVar1;
  uVar3 = this->samplespersec;
  ADesc->AudioSamplingRate = (Rational)((ulong)uVar3 | 0x100000000);
  ADesc->AvgBps = this->avgbps;
  ADesc->BlockAlign = (uint)this->blockalign;
  uVar2 = this->bitspersample;
  ADesc->QuantizationBits = (uint)uVar2;
  dVar4 = ceil((double)(int)uVar3 /
               ((double)PictureRate.Numerator / (double)PictureRate.Denominator));
  ADesc->ContainerDuration = this->data_len / ((int)(long)dVar4 * (uint)(uVar2 >> 3) * (uint)uVar1);
  ADesc->ChannelFormat = CF_NONE;
  return;
}

Assistant:

void
ASDCP::Wav::SimpleWaveHeader::FillADesc(ASDCP::PCM::AudioDescriptor& ADesc, ASDCP::Rational PictureRate) const
{
  ADesc.EditRate = PictureRate;

  ADesc.LinkedTrackID = 0;
  ADesc.Locked = 0;
  ADesc.ChannelCount = nchannels;
  ADesc.AudioSamplingRate = Rational(samplespersec, 1);
  ADesc.AvgBps = avgbps;
  ADesc.BlockAlign = blockalign;
  ADesc.QuantizationBits = bitspersample;
  ui32_t FrameBufferSize = ASDCP::PCM::CalcFrameBufferSize(ADesc);
  ADesc.ContainerDuration = data_len / FrameBufferSize;
  ADesc.ChannelFormat = PCM::CF_NONE;
}